

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall btQuantizedBvh::buildInternal(btQuantizedBvh *this)

{
  bool bVar1;
  int newsize;
  btBvhSubtreeInfo *this_00;
  btQuantizedBvhNode *pbVar2;
  btAlignedObjectArray<btQuantizedBvhNode> *in_RDI;
  btBvhSubtreeInfo *subtree;
  int numLeafNodes;
  int local_74;
  btAlignedObjectArray<btOptimizedBvhNode> *in_stack_ffffffffffffff90;
  btBvhSubtreeInfo *in_stack_ffffffffffffff98;
  btAlignedObjectArray<btBvhSubtreeInfo> *in_stack_ffffffffffffffa0;
  btBvhSubtreeInfo local_48;
  btBvhSubtreeInfo *local_28;
  undefined1 local_1c [4];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  *(undefined1 *)(in_RDI + 2) = 1;
  iVar3 = 0;
  if ((undefined1  [32])((undefined1  [32])in_RDI[2] & (undefined1  [32])0x1) !=
      (undefined1  [32])0x0) {
    iVar3 = btAlignedObjectArray<btQuantizedBvhNode>::size
                      ((btAlignedObjectArray<btQuantizedBvhNode> *)&in_RDI[4].m_capacity);
    in_stack_ffffffffffffffa0 = (btAlignedObjectArray<btBvhSubtreeInfo> *)&in_RDI[5].m_capacity;
    newsize = iVar3 << 1;
    memset(local_1c,0,0x10);
    btAlignedObjectArray<btQuantizedBvhNode>::resize
              (in_RDI,newsize,(btQuantizedBvhNode *)in_stack_ffffffffffffffa0);
  }
  *(undefined4 *)&in_RDI[1].field_0x1c = 0;
  buildTree((btQuantizedBvh *)CONCAT44(iVar3,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
            in_stack_ffffffffffffffe8);
  if ((undefined1  [32])((undefined1  [32])in_RDI[2] & (undefined1  [32])0x1) !=
      (undefined1  [32])0x0) {
    iVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::size
                      ((btAlignedObjectArray<btBvhSubtreeInfo> *)&in_RDI[6].m_data);
    if (iVar3 == 0) {
      in_stack_ffffffffffffff90 = (btAlignedObjectArray<btOptimizedBvhNode> *)&in_RDI[6].m_data;
      btBvhSubtreeInfo::btBvhSubtreeInfo(&local_48);
      this_00 = btAlignedObjectArray<btBvhSubtreeInfo>::expand
                          (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_28 = this_00;
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)&in_RDI[5].m_capacity,0);
      btBvhSubtreeInfo::setAabbFromQuantizeNode(this_00,pbVar2);
      local_28->m_rootNodeIndex = 0;
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)&in_RDI[5].m_capacity,0);
      bVar1 = btQuantizedBvhNode::isLeafNode(pbVar2);
      if (bVar1) {
        local_74 = 1;
      }
      else {
        pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)&in_RDI[5].m_capacity,0);
        local_74 = btQuantizedBvhNode::getEscapeIndex(pbVar2);
      }
      local_28->m_subtreeSize = local_74;
    }
  }
  iVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::size
                    ((btAlignedObjectArray<btBvhSubtreeInfo> *)&in_RDI[6].m_data);
  *(int *)&in_RDI[7].m_data = iVar3;
  btAlignedObjectArray<btQuantizedBvhNode>::clear
            ((btAlignedObjectArray<btQuantizedBvhNode> *)in_stack_ffffffffffffff90);
  btAlignedObjectArray<btOptimizedBvhNode>::clear(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void btQuantizedBvh::buildInternal()
{
	///assumes that caller filled in the m_quantizedLeafNodes
	m_useQuantization = true;
	int numLeafNodes = 0;
	
	if (m_useQuantization)
	{
		//now we have an array of leafnodes in m_leafNodes
		numLeafNodes = m_quantizedLeafNodes.size();

		m_quantizedContiguousNodes.resize(2*numLeafNodes);

	}

	m_curNodeIndex = 0;

	buildTree(0,numLeafNodes);

	///if the entire tree is small then subtree size, we need to create a header info for the tree
	if(m_useQuantization && !m_SubtreeHeaders.size())
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(m_quantizedContiguousNodes[0]);
		subtree.m_rootNodeIndex = 0;
		subtree.m_subtreeSize = m_quantizedContiguousNodes[0].isLeafNode() ? 1 : m_quantizedContiguousNodes[0].getEscapeIndex();
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

	//PCK: clear m_quantizedLeafNodes and m_leafNodes, they are temporary
	m_quantizedLeafNodes.clear();
	m_leafNodes.clear();
}